

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

usize __thiscall
Console::Prompt::Private::readUnbufferedEscapedSequence(Private *this,char *seqStart,char *buffer)

{
  code *pcVar1;
  usize uVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  ssize_t sVar5;
  usize uVar6;
  undefined8 uStack_38;
  char ch;
  
  uVar2 = 1;
  uStack_38 = in_RAX;
  do {
    uVar6 = uVar2;
    sVar5 = read(0,&ch,1);
    if (sVar5 != 1) {
      iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                            ,0x47d,"read(STDIN_FILENO, &ch, 1) == 1");
      if (iVar4 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    buffer[uVar6 - 1] = ch;
    if (seqStart[1] != '[') break;
    bVar3 = isSeqAttributeChar(ch);
    uVar2 = uVar6 + 1;
  } while (bVar3);
  buffer[uVar6] = '\0';
  return uVar6;
}

Assistant:

usize readUnbufferedEscapedSequence(const char* seqStart, char* buffer)
  {
    for(char* start = buffer, ch;;)
    {
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      *(buffer++) = ch;
      if(seqStart[1] != '[' || !isSeqAttributeChar(ch))
      {
        *buffer = '\0';
        return buffer - start;
      }
    }
  }